

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void __thiscall duckdb::Node::InitMerge(Node *this,ART *art,unsafe_vector<idx_t> *upper_bounds)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  idx_t iVar2;
  NType NVar3;
  NType type;
  byte bVar4;
  undefined8 *puVar5;
  type paVar6;
  long *plVar7;
  pointer pFVar8;
  data_ptr_t pdVar9;
  InternalException *pIVar10;
  long *plVar11;
  idx_t i;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  Node *pNVar16;
  ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node> scanner;
  Prefix prefix;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 *local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 *local_90;
  undefined8 *puStack_88;
  undefined8 *local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  local_c0 = 0;
  uStack_b8 = 0;
  local_b0 = (undefined8 *)0x0;
  uStack_a8 = 0;
  local_a0 = 0;
  uStack_98 = 0;
  local_90 = (undefined8 *)0x0;
  puStack_88 = (undefined8 *)0x0;
  local_80 = (undefined8 *)0x0;
  lStack_78 = 0;
  ::std::
  _Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry>_>
  ::_M_initialize_map((_Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry>_>
                       *)&local_c0,0);
  if (local_90 == local_80 + -2) {
    ::std::
    deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
    ::_M_push_back_aux<duckdb::Node&>
              ((deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                *)&local_c0,this);
  }
  else {
    *local_90 = this;
    *(undefined1 *)(local_90 + 1) = 0;
    local_90 = local_90 + 2;
  }
  if (local_90 != local_b0) {
    do {
      puVar5 = local_90;
      if (local_90 == puStack_88) {
        puVar5 = (undefined8 *)(*(long *)(lStack_78 + -8) + 0x200);
      }
      if (*(char *)(puVar5 + -1) == '\x01') {
        plVar7 = (long *)puVar5[-2];
        NVar3 = (NType)((ulong)*plVar7 >> 0x38);
        type = NVar3 & 0x7f;
        if (type != LEAF_INLINED) {
          if ((NVar3 & 0x7f) == LEAF) {
            pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_70,"deprecated ART storage in InitMerge","");
            InternalException::InternalException(pIVar10,&local_70);
            __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          bVar4 = GetAllocatorIdx(type);
          *plVar7 = *plVar7 + (upper_bounds->
                              super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[bVar4];
        }
        if (local_90 == puStack_88) {
          operator_delete(puStack_88);
          puStack_88 = *(undefined8 **)(lStack_78 + -8);
          local_80 = puStack_88 + 0x40;
          local_90 = puStack_88 + 0x3e;
          lStack_78 = lStack_78 + -8;
        }
        else {
          local_90 = local_90 + -2;
        }
      }
      else {
        *(undefined1 *)(puVar5 + -1) = 1;
        uVar12 = *(ulong *)puVar5[-2];
        NVar3 = (NType)(uVar12 >> 0x38);
        uVar14 = (uint)(uVar12 >> 0x20);
        switch(NVar3 & 0x7f) {
        case PREFIX:
          Prefix::Prefix((Prefix *)&local_70,art,(Node)((IndexPointer *)puVar5[-2])->data,true,false
                        );
          if (local_90 == local_80 + -2) {
            ::std::
            deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
            ::_M_push_back_aux<duckdb::Node&>
                      ((deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                        *)&local_c0,(Node *)local_70._M_string_length);
          }
          else {
            *local_90 = local_70._M_string_length;
            *(undefined1 *)(local_90 + 1) = 0;
            local_90 = local_90 + 2;
          }
          break;
        case LEAF:
        case LEAF_INLINED:
        case NODE_7_LEAF:
        case NODE_15_LEAF:
        case NODE_256_LEAF:
          break;
        case NODE_4:
          paVar6 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                   ::operator*(&art->allocators);
          _Var1._M_head_impl =
               paVar6->_M_elems[2].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
          plVar7 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                             ((uVar12 & 0xffffffff) %
                             *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
          for (plVar11 = (long *)*plVar7; (uVar12 & 0xffffffff) != plVar11[1];
              plVar11 = (long *)*plVar11) {
            plVar7 = plVar11;
          }
          pFVar8 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                   ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                                 *)(*plVar7 + 0x10));
          pdVar9 = FixedSizeBuffer::Get(pFVar8,true);
          lVar13 = (ulong)(uVar14 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
          iVar2 = (_Var1._M_head_impl)->bitmask_offset;
          if (pdVar9[iVar2 + lVar13] != '\0') {
            uVar12 = 0;
            pNVar16 = (Node *)(pdVar9 + iVar2 + lVar13);
            do {
              pNVar16 = pNVar16 + 1;
              if (local_90 == local_80 + -2) {
                ::std::
                deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                ::_M_push_back_aux<duckdb::Node&>
                          ((deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                            *)&local_c0,pNVar16);
              }
              else {
                *local_90 = pNVar16;
                *(undefined1 *)(local_90 + 1) = 0;
                local_90 = local_90 + 2;
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 < (byte)(((Node *)(pdVar9 + iVar2 + lVar13))->super_IndexPointer).data);
          }
          break;
        case NODE_16:
          paVar6 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                   ::operator*(&art->allocators);
          _Var1._M_head_impl =
               paVar6->_M_elems[3].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
          plVar7 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                             ((uVar12 & 0xffffffff) %
                             *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
          for (plVar11 = (long *)*plVar7; (uVar12 & 0xffffffff) != plVar11[1];
              plVar11 = (long *)*plVar11) {
            plVar7 = plVar11;
          }
          pFVar8 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                   ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                                 *)(*plVar7 + 0x10));
          pdVar9 = FixedSizeBuffer::Get(pFVar8,true);
          lVar13 = (ulong)(uVar14 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
          iVar2 = (_Var1._M_head_impl)->bitmask_offset;
          if (pdVar9[iVar2 + lVar13] != '\0') {
            pNVar16 = (Node *)(pdVar9 + iVar2 + lVar13 + 0x18);
            uVar12 = 0;
            do {
              if (local_90 == local_80 + -2) {
                ::std::
                deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                ::_M_push_back_aux<duckdb::Node&>
                          ((deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                            *)&local_c0,pNVar16);
              }
              else {
                *local_90 = pNVar16;
                *(undefined1 *)(local_90 + 1) = 0;
                local_90 = local_90 + 2;
              }
              uVar12 = uVar12 + 1;
              pNVar16 = pNVar16 + 1;
            } while (uVar12 < pdVar9[iVar2 + lVar13]);
          }
          break;
        case NODE_48:
          paVar6 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                   ::operator*(&art->allocators);
          _Var1._M_head_impl =
               paVar6->_M_elems[4].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
          plVar7 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                             ((uVar12 & 0xffffffff) %
                             *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
          for (plVar11 = (long *)*plVar7; (uVar12 & 0xffffffff) != plVar11[1];
              plVar11 = (long *)*plVar11) {
            plVar7 = plVar11;
          }
          pFVar8 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                   ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                                 *)(*plVar7 + 0x10));
          pdVar9 = FixedSizeBuffer::Get(pFVar8,true);
          lVar15 = (ulong)(uVar14 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
          iVar2 = (_Var1._M_head_impl)->bitmask_offset;
          lVar13 = 0;
          do {
            if ((ulong)pdVar9[lVar13 + iVar2 + lVar15 + 1] != 0x30) {
              if (local_90 == local_80 + -2) {
                ::std::
                deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                ::_M_push_back_aux<duckdb::Node&>
                          ((deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                            *)&local_c0,
                           (Node *)(pdVar9 + (ulong)pdVar9[lVar13 + iVar2 + lVar15 + 1] * 8 +
                                             iVar2 + lVar15 + 0x108));
              }
              else {
                *local_90 = (Node *)(pdVar9 + (ulong)pdVar9[lVar13 + iVar2 + lVar15 + 1] * 8 +
                                              iVar2 + lVar15 + 0x108);
                *(undefined1 *)(local_90 + 1) = 0;
                local_90 = local_90 + 2;
              }
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x100);
          break;
        case NODE_256:
          paVar6 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                   ::operator*(&art->allocators);
          _Var1._M_head_impl =
               paVar6->_M_elems[5].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
          plVar7 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                             ((uVar12 & 0xffffffff) %
                             *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
          for (plVar11 = (long *)*plVar7; (uVar12 & 0xffffffff) != plVar11[1];
              plVar11 = (long *)*plVar11) {
            plVar7 = plVar11;
          }
          pFVar8 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                   ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                                 *)(*plVar7 + 0x10));
          pdVar9 = FixedSizeBuffer::Get(pFVar8,true);
          lVar13 = (_Var1._M_head_impl)->bitmask_offset +
                   (ulong)(uVar14 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
          lVar15 = 0;
          do {
            if (pdVar9[lVar15 + lVar13 + 0xf] != '\0') {
              if (local_90 == local_80 + -2) {
                ::std::
                deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                ::_M_push_back_aux<duckdb::Node&>
                          ((deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                            *)&local_c0,(Node *)(pdVar9 + lVar15 + lVar13 + 8));
              }
              else {
                *local_90 = (Node *)(pdVar9 + lVar15 + lVar13 + 8);
                *(undefined1 *)(local_90 + 1) = 0;
                local_90 = local_90 + 2;
              }
            }
            lVar15 = lVar15 + 8;
          } while (lVar15 != 0x800);
          break;
        default:
          pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"invalid node type for ART ScanHandleLast: %s","");
          EnumUtil::ToString<duckdb::NType>(&local_50,NVar3 & 0x7f);
          InternalException::InternalException<std::__cxx11::string>(pIVar10,&local_70,&local_50);
          __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    } while (local_90 != local_b0);
  }
  ::std::
  _Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry>_>
  ::~_Deque_base((_Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry>_>
                  *)&local_c0);
  return;
}

Assistant:

void Node::InitMerge(ART &art, const unsafe_vector<idx_t> &upper_bounds) {
	D_ASSERT(HasMetadata());
	ARTScanner<ARTScanHandling::POP, Node> scanner(art);

	auto handler = [&upper_bounds](Node &node) {
		const auto type = node.GetType();
		if (node.GetType() == NType::LEAF_INLINED) {
			return ARTScanHandlingResult::CONTINUE;
		}
		if (type == NType::LEAF) {
			throw InternalException("deprecated ART storage in InitMerge");
		}
		const auto idx = GetAllocatorIdx(type);
		node.IncreaseBufferId(upper_bounds[idx]);
		return ARTScanHandlingResult::CONTINUE;
	};

	scanner.Init(handler, *this);
	scanner.Scan(handler);
}